

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegexpPtr xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegStatePtr *ppxVar3;
  xmlRegStatePtr pxVar4;
  xmlRegTrans *pxVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  xmlRegexpPtr comp;
  xmlChar **ppxVar11;
  xmlChar **ppxVar12;
  xmlRegexpPtr pxVar13;
  xmlChar *pxVar14;
  int *__s;
  size_t __n;
  long lVar15;
  long lVar16;
  int iVar17;
  void **__s_00;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  size_t __n_00;
  int iVar21;
  long lVar22;
  bool bVar23;
  
  comp = (xmlRegexpPtr)(*xmlMalloc)(0x68);
  if (comp == (xmlRegexpPtr)0x0) {
    xmlRegexpErrMemory(ctxt,"compiling regexp");
LAB_001a88ca:
    comp = (xmlRegexpPtr)0x0;
  }
  else {
    comp->transdata = (void **)0x0;
    *(undefined8 *)&comp->nbstrings = 0;
    *(undefined8 *)&comp->nbstates = 0;
    comp->compact = (int *)0x0;
    comp->counters = (xmlRegCounter *)0x0;
    comp->determinist = 0;
    comp->flags = 0;
    comp->atoms = (xmlRegAtomPtr *)0x0;
    *(undefined8 *)&comp->nbCounters = 0;
    comp->states = (xmlRegStatePtr *)0x0;
    *(undefined8 *)&comp->nbAtoms = 0;
    comp->string = (xmlChar *)0x0;
    *(undefined8 *)&comp->nbStates = 0;
    comp->stringMap = (xmlChar **)0x0;
    comp->string = ctxt->string;
    comp->nbStates = ctxt->nbStates;
    comp->states = ctxt->states;
    comp->nbAtoms = ctxt->nbAtoms;
    comp->atoms = ctxt->atoms;
    comp->nbCounters = ctxt->nbCounters;
    comp->counters = ctxt->counters;
    iVar17 = ctxt->determinist;
    comp->determinist = iVar17;
    comp->flags = ctxt->flags;
    if (iVar17 == -1) {
      xmlRegexpIsDeterminist(comp);
    }
    if (((((comp->determinist != 0) && (comp->nbCounters == 0)) && (ctxt->negs == 0)) &&
        ((comp->atoms != (xmlRegAtomPtr *)0x0 &&
         (pxVar2 = *comp->atoms, pxVar2 != (xmlRegAtomPtr)0x0)))) &&
       (pxVar2->type == XML_REGEXP_STRING)) {
      ppxVar11 = (xmlChar **)(*xmlMalloc)((long)comp->nbStates << 2);
      if (ppxVar11 == (xmlChar **)0x0) {
        xmlRegexpErrMemory(ctxt,"compiling regexp");
LAB_001a8e37:
        iVar20 = 1;
        pxVar13 = comp;
      }
      else {
        if (comp->nbStates < 1) {
          iVar17 = 0;
        }
        else {
          ppxVar3 = comp->states;
          lVar15 = 0;
          iVar17 = 0;
          do {
            if (ppxVar3[lVar15] == (xmlRegStatePtr)0x0) {
              *(undefined4 *)((long)ppxVar11 + lVar15 * 4) = 0xffffffff;
            }
            else {
              *(int *)((long)ppxVar11 + lVar15 * 4) = iVar17;
              iVar17 = iVar17 + 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < comp->nbStates);
        }
        ppxVar12 = (xmlChar **)(*xmlMalloc)((long)comp->nbAtoms << 3);
        if (ppxVar12 == (xmlChar **)0x0) {
          xmlRegexpErrMemory(ctxt,"compiling regexp");
          (*xmlFree)(ppxVar11);
          goto LAB_001a8e37;
        }
        pxVar13 = (xmlRegexpPtr)(*xmlMalloc)((long)comp->nbAtoms << 2);
        if (pxVar13 == (xmlRegexpPtr)0x0) {
          xmlRegexpErrMemory(ctxt,"compiling regexp");
LAB_001a8ac3:
          (*xmlFree)(ppxVar12);
          ppxVar12 = ppxVar11;
LAB_001a8e34:
          (*xmlFree)(ppxVar12);
          goto LAB_001a8e37;
        }
        if (comp->nbAtoms < 1) {
          uVar18 = 0;
        }
        else {
          lVar15 = 0;
          uVar18 = 0;
          do {
            pxVar2 = comp->atoms[lVar15];
            if ((pxVar2->type != XML_REGEXP_STRING) || (pxVar2->quant != XML_REGEXP_QUANT_ONCE)) {
              (*xmlFree)(ppxVar11);
              (*xmlFree)(pxVar13);
              if (0 < (int)uVar18) {
                uVar19 = 0;
                do {
                  (*xmlFree)(ppxVar12[uVar19]);
                  uVar19 = uVar19 + 1;
                } while (uVar18 != uVar19);
              }
              goto LAB_001a8e34;
            }
            pxVar14 = (xmlChar *)pxVar2->valuep;
            bVar23 = 0 < (int)uVar18;
            if ((int)uVar18 < 1) {
LAB_001a8a3e:
              *(uint *)((long)&pxVar13->string + lVar15 * 4) = uVar18;
              pxVar14 = xmlStrdup(pxVar14);
              ppxVar12[(int)uVar18] = pxVar14;
              if (pxVar14 != (xmlChar *)0x0) {
                uVar18 = uVar18 + 1;
                goto LAB_001a8a71;
              }
              if (0 < (int)uVar18) {
                uVar19 = 0;
                do {
                  (*xmlFree)(ppxVar12[uVar19]);
                  uVar19 = uVar19 + 1;
                } while (uVar18 != uVar19);
              }
              (*xmlFree)(pxVar13);
              goto LAB_001a8ac3;
            }
            iVar9 = xmlStrEqual(*ppxVar12,pxVar14);
            uVar19 = 0;
            if (iVar9 == 0) {
              uVar19 = 0;
              do {
                if ((ulong)uVar18 - 1 == uVar19) goto LAB_001a8a3e;
                iVar9 = xmlStrEqual(ppxVar12[uVar19 + 1],pxVar14);
                uVar19 = uVar19 + 1;
              } while (iVar9 == 0);
              bVar23 = uVar19 < uVar18;
            }
            *(int *)((long)&pxVar13->string + lVar15 * 4) = (int)uVar19;
            if (!bVar23) goto LAB_001a8a3e;
LAB_001a8a71:
            lVar15 = lVar15 + 1;
          } while (lVar15 < comp->nbAtoms);
        }
        iVar9 = uVar18 + 1;
        __s = (int *)0x0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (long)iVar9;
        if ((ulong)(long)(iVar17 + 1) <=
            SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar7,0) >> 2) {
          __n_00 = (long)(iVar17 + 1) * (long)iVar9 * 4;
          __s = (int *)(*xmlMalloc)(__n_00);
          if (__s != (int *)0x0) {
            memset(__s,0,__n_00);
          }
        }
        if (__s == (int *)0x0) {
          (*xmlFree)(ppxVar11);
          (*xmlFree)(pxVar13);
          if (0 < (int)uVar18) {
            uVar19 = 0;
            do {
              (*xmlFree)(ppxVar12[uVar19]);
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
          }
          goto LAB_001a8e34;
        }
        iVar21 = 0;
        if (0 < comp->nbStates) {
          __n = (long)iVar17 * (long)(int)uVar18 * 8;
          __s_00 = (void **)0x0;
LAB_001a8b7d:
          iVar1 = *(int *)((long)ppxVar11 + (long)iVar21 * 4);
          if (iVar1 == -1) {
            iVar20 = 0x16;
          }
          else {
            pxVar4 = comp->states[iVar21];
            __s[iVar1 * iVar9] = pxVar4->type;
            iVar20 = 0;
            if (0 < pxVar4->nbTrans) {
              lVar15 = 8;
              lVar22 = 0;
LAB_001a8bd7:
              pxVar5 = pxVar4->trans;
              if ((*(int *)((long)&pxVar5->atom + lVar15) == -1) ||
                 (piVar6 = *(int **)((long)pxVar5 + lVar15 + -8), piVar6 == (int *)0x0))
              goto LAB_001a8cc2;
              iVar20 = *(int *)((long)&pxVar13->string + (long)*piVar6 * 4);
              if ((*(long *)(piVar6 + 0x16) != 0) && (__s_00 == (void **)0x0)) {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = (long)(int)uVar18;
                __s_00 = (void **)0x0;
                if (((ulong)(long)iVar17 <=
                     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar8,0) >> 3) &&
                   (__s_00 = (void **)(*xmlMalloc)(__n), __s_00 != (void **)0x0)) {
                  memset(__s_00,0,__n);
                }
                if (__s_00 == (void **)0x0) {
                  xmlRegexpErrMemory(ctxt,"compiling regexp");
                  __s_00 = (void **)0x0;
                  iVar20 = 0;
                  goto LAB_001a8ceb;
                }
              }
              lVar16 = (long)(iVar1 * iVar9 + iVar20);
              iVar10 = *(int *)((long)ppxVar11 + (long)*(int *)((long)&pxVar5->atom + lVar15) * 4) +
                       1;
              if (__s[lVar16 + 1] == 0) {
                __s[lVar16 + 1] = iVar10;
                if (__s_00 == (void **)0x0) {
                  __s_00 = (void **)0x0;
                }
                else {
                  __s_00[(int)(iVar20 + iVar1 * uVar18)] =
                       *(void **)(*(long *)((long)pxVar5 + lVar15 + -8) + 0x58);
                }
                goto LAB_001a8cc2;
              }
              if (__s[lVar16 + 1] == iVar10) goto LAB_001a8cc2;
              comp->determinist = 0;
              if (__s_00 != (void **)0x0) {
                (*xmlFree)(__s_00);
              }
              (*xmlFree)(__s);
              (*xmlFree)(ppxVar11);
              (*xmlFree)(pxVar13);
              uVar19 = 0;
              if (0 < (int)uVar18) {
                do {
                  (*xmlFree)(ppxVar12[uVar19]);
                  uVar19 = uVar19 + 1;
                } while (uVar18 != uVar19);
              }
              iVar21 = (int)uVar19;
              (*xmlFree)(ppxVar12);
              iVar20 = 0x1d;
            }
          }
          goto LAB_001a8ceb;
        }
        __s_00 = (void **)0x0;
LAB_001a8e64:
        comp->determinist = 1;
        if (comp->states != (xmlRegStatePtr *)0x0) {
          if (0 < comp->nbStates) {
            lVar15 = 0;
            do {
              xmlRegFreeState(comp->states[lVar15]);
              lVar15 = lVar15 + 1;
            } while (lVar15 < comp->nbStates);
          }
          (*xmlFree)(comp->states);
        }
        comp->states = (xmlRegStatePtr *)0x0;
        comp->nbStates = 0;
        if (comp->atoms != (xmlRegAtomPtr *)0x0) {
          if (0 < comp->nbAtoms) {
            lVar15 = 0;
            do {
              xmlRegFreeAtom(comp->atoms[lVar15]);
              lVar15 = lVar15 + 1;
            } while (lVar15 < comp->nbAtoms);
          }
          (*xmlFree)(comp->atoms);
        }
        comp->atoms = (xmlRegAtomPtr *)0x0;
        comp->nbAtoms = 0;
        comp->compact = __s;
        comp->transdata = __s_00;
        comp->stringMap = ppxVar12;
        comp->nbstrings = uVar18;
        comp->nbstates = iVar17;
        (*xmlFree)(ppxVar11);
        iVar20 = 0;
      }
      (*xmlFree)(pxVar13);
LAB_001a8e49:
      if ((iVar20 != 0x1d) && (iVar20 != 0)) goto LAB_001a88ca;
    }
    ctxt->string = (xmlChar *)0x0;
    ctxt->nbStates = 0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    ctxt->nbAtoms = 0;
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->nbCounters = 0;
    ctxt->counters = (xmlRegCounter *)0x0;
  }
  return comp;
LAB_001a8cc2:
  lVar22 = lVar22 + 1;
  lVar15 = lVar15 + 0x18;
  if (pxVar4->nbTrans <= lVar22) goto code_r0x001a8cd6;
  goto LAB_001a8bd7;
code_r0x001a8cd6:
  iVar20 = 0;
LAB_001a8ceb:
  if ((iVar20 != 0x16) && (iVar20 != 0)) goto LAB_001a8e49;
  iVar21 = iVar21 + 1;
  if (comp->nbStates <= iVar21) goto LAB_001a8e64;
  goto LAB_001a8b7d;
}

Assistant:

static xmlRegexpPtr
xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt) {
    xmlRegexpPtr ret;

    ret = (xmlRegexpPtr) xmlMalloc(sizeof(xmlRegexp));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt, "compiling regexp");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegexp));
    ret->string = ctxt->string;
    ret->nbStates = ctxt->nbStates;
    ret->states = ctxt->states;
    ret->nbAtoms = ctxt->nbAtoms;
    ret->atoms = ctxt->atoms;
    ret->nbCounters = ctxt->nbCounters;
    ret->counters = ctxt->counters;
    ret->determinist = ctxt->determinist;
    ret->flags = ctxt->flags;
    if (ret->determinist == -1) {
        xmlRegexpIsDeterminist(ret);
    }

    if ((ret->determinist != 0) &&
	(ret->nbCounters == 0) &&
	(ctxt->negs == 0) &&
	(ret->atoms != NULL) &&
	(ret->atoms[0] != NULL) &&
	(ret->atoms[0]->type == XML_REGEXP_STRING)) {
	int i, j, nbstates = 0, nbatoms = 0;
	int *stateRemap;
	int *stringRemap;
	int *transitions;
	void **transdata;
	xmlChar **stringMap;
        xmlChar *value;

	/*
	 * Switch to a compact representation
	 * 1/ counting the effective number of states left
	 * 2/ counting the unique number of atoms, and check that
	 *    they are all of the string type
	 * 3/ build a table state x atom for the transitions
	 */

	stateRemap = xmlMalloc(ret->nbStates * sizeof(int));
	if (stateRemap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbStates;i++) {
	    if (ret->states[i] != NULL) {
		stateRemap[i] = nbstates;
		nbstates++;
	    } else {
		stateRemap[i] = -1;
	    }
	}
#ifdef DEBUG_COMPACTION
	printf("Final: %d states\n", nbstates);
#endif
	stringMap = xmlMalloc(ret->nbAtoms * sizeof(char *));
	if (stringMap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	stringRemap = xmlMalloc(ret->nbAtoms * sizeof(int));
	if (stringRemap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(stringMap);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbAtoms;i++) {
	    if ((ret->atoms[i]->type == XML_REGEXP_STRING) &&
		(ret->atoms[i]->quant == XML_REGEXP_QUANT_ONCE)) {
		value = ret->atoms[i]->valuep;
                for (j = 0;j < nbatoms;j++) {
		    if (xmlStrEqual(stringMap[j], value)) {
			stringRemap[i] = j;
			break;
		    }
		}
		if (j >= nbatoms) {
		    stringRemap[i] = nbatoms;
		    stringMap[nbatoms] = xmlStrdup(value);
		    if (stringMap[nbatoms] == NULL) {
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringRemap);
			xmlFree(stringMap);
			xmlFree(stateRemap);
			xmlFree(ret);
			return(NULL);
		    }
		    nbatoms++;
		}
	    } else {
		xmlFree(stateRemap);
		xmlFree(stringRemap);
		for (i = 0;i < nbatoms;i++)
		    xmlFree(stringMap[i]);
		xmlFree(stringMap);
		xmlFree(ret);
		return(NULL);
	    }
	}
#ifdef DEBUG_COMPACTION
	printf("Final: %d atoms\n", nbatoms);
#endif
	transitions = (int *) xmlRegCalloc2(nbstates + 1, nbatoms + 1,
                                            sizeof(int));
	if (transitions == NULL) {
	    xmlFree(stateRemap);
	    xmlFree(stringRemap);
            for (i = 0;i < nbatoms;i++)
		xmlFree(stringMap[i]);
	    xmlFree(stringMap);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * Allocate the transition table. The first entry for each
	 * state corresponds to the state type.
	 */
	transdata = NULL;

	for (i = 0;i < ret->nbStates;i++) {
	    int stateno, atomno, targetno, prev;
	    xmlRegStatePtr state;
	    xmlRegTransPtr trans;

	    stateno = stateRemap[i];
	    if (stateno == -1)
		continue;
	    state = ret->states[i];

	    transitions[stateno * (nbatoms + 1)] = state->type;

	    for (j = 0;j < state->nbTrans;j++) {
		trans = &(state->trans[j]);
		if ((trans->to == -1) || (trans->atom == NULL))
		    continue;
                atomno = stringRemap[trans->atom->no];
		if ((trans->atom->data != NULL) && (transdata == NULL)) {
		    transdata = (void **) xmlRegCalloc2(nbstates, nbatoms,
			                                sizeof(void *));
		    if (transdata == NULL) {
			xmlRegexpErrMemory(ctxt, "compiling regexp");
			break;
		    }
		}
		targetno = stateRemap[trans->to];
		/*
		 * if the same atom can generate transitions to 2 different
		 * states then it means the automata is not deterministic and
		 * the compact form can't be used !
		 */
		prev = transitions[stateno * (nbatoms + 1) + atomno + 1];
		if (prev != 0) {
		    if (prev != targetno + 1) {
			ret->determinist = 0;
#ifdef DEBUG_COMPACTION
			printf("Indet: state %d trans %d, atom %d to %d : %d to %d\n",
			       i, j, trans->atom->no, trans->to, atomno, targetno);
			printf("       previous to is %d\n", prev);
#endif
			if (transdata != NULL)
			    xmlFree(transdata);
			xmlFree(transitions);
			xmlFree(stateRemap);
			xmlFree(stringRemap);
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringMap);
			goto not_determ;
		    }
		} else {
#if 0
		    printf("State %d trans %d: atom %d to %d : %d to %d\n",
			   i, j, trans->atom->no, trans->to, atomno, targetno);
#endif
		    transitions[stateno * (nbatoms + 1) + atomno + 1] =
			targetno + 1; /* to avoid 0 */
		    if (transdata != NULL)
			transdata[stateno * nbatoms + atomno] =
			    trans->atom->data;
		}
	    }
	}
	ret->determinist = 1;
#ifdef DEBUG_COMPACTION
	/*
	 * Debug
	 */
	for (i = 0;i < nbstates;i++) {
	    for (j = 0;j < nbatoms + 1;j++) {
                printf("%02d ", transitions[i * (nbatoms + 1) + j]);
	    }
	    printf("\n");
	}
	printf("\n");
#endif
	/*
	 * Cleanup of the old data
	 */
	if (ret->states != NULL) {
	    for (i = 0;i < ret->nbStates;i++)
		xmlRegFreeState(ret->states[i]);
	    xmlFree(ret->states);
	}
	ret->states = NULL;
	ret->nbStates = 0;
	if (ret->atoms != NULL) {
	    for (i = 0;i < ret->nbAtoms;i++)
		xmlRegFreeAtom(ret->atoms[i]);
	    xmlFree(ret->atoms);
	}
	ret->atoms = NULL;
	ret->nbAtoms = 0;

	ret->compact = transitions;
	ret->transdata = transdata;
	ret->stringMap = stringMap;
	ret->nbstrings = nbatoms;
	ret->nbstates = nbstates;
	xmlFree(stateRemap);
	xmlFree(stringRemap);
    }
not_determ:
    ctxt->string = NULL;
    ctxt->nbStates = 0;
    ctxt->states = NULL;
    ctxt->nbAtoms = 0;
    ctxt->atoms = NULL;
    ctxt->nbCounters = 0;
    ctxt->counters = NULL;
    return(ret);
}